

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O1

uint * fetchTransformedBilinearARGB32PM<(TextureBlendType)5>
                 (uint *buffer,Operator *param_2,QSpanData *data,int y,int x,int length)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  uchar *puVar4;
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  undefined1 auVar49 [15];
  undefined1 auVar50 [15];
  undefined1 auVar51 [15];
  undefined1 auVar52 [15];
  undefined1 auVar53 [15];
  undefined1 auVar54 [15];
  undefined1 auVar55 [15];
  undefined1 auVar56 [15];
  undefined1 auVar57 [15];
  undefined1 auVar58 [15];
  undefined1 auVar59 [15];
  undefined1 auVar60 [15];
  undefined1 auVar61 [15];
  undefined1 auVar62 [15];
  undefined1 auVar63 [15];
  undefined1 auVar64 [15];
  undefined1 auVar65 [15];
  undefined1 auVar66 [15];
  undefined1 auVar67 [15];
  undefined1 auVar68 [15];
  undefined1 auVar69 [15];
  undefined1 auVar70 [15];
  undefined1 auVar71 [15];
  undefined1 auVar72 [15];
  undefined1 auVar73 [15];
  undefined1 auVar74 [15];
  undefined1 auVar75 [15];
  unkuint9 Var76;
  undefined1 auVar77 [15];
  undefined1 auVar78 [13];
  undefined1 auVar79 [15];
  unkuint9 Var80;
  undefined1 auVar81 [15];
  undefined1 auVar82 [13];
  undefined1 auVar83 [15];
  undefined1 auVar84 [15];
  undefined1 auVar85 [13];
  undefined1 auVar86 [15];
  undefined1 auVar87 [15];
  undefined1 auVar88 [13];
  undefined1 auVar89 [15];
  undefined1 auVar90 [15];
  undefined1 auVar91 [13];
  undefined1 auVar92 [15];
  undefined1 auVar93 [15];
  undefined1 auVar94 [13];
  undefined1 auVar95 [15];
  undefined1 auVar96 [15];
  undefined1 auVar97 [13];
  undefined1 auVar98 [15];
  undefined1 auVar99 [15];
  undefined1 auVar100 [13];
  undefined1 auVar101 [15];
  undefined1 auVar102 [15];
  undefined1 auVar103 [13];
  undefined1 auVar104 [15];
  undefined1 auVar105 [15];
  undefined1 auVar106 [13];
  undefined1 auVar107 [15];
  undefined1 auVar108 [15];
  undefined1 auVar109 [15];
  undefined1 auVar110 [15];
  undefined1 auVar111 [15];
  undefined1 auVar112 [15];
  undefined1 auVar113 [15];
  undefined1 auVar114 [15];
  undefined1 auVar115 [15];
  undefined1 auVar116 [15];
  uint uVar117;
  int iVar118;
  uint uVar119;
  long lVar120;
  int iVar121;
  long lVar122;
  int iVar123;
  int iVar124;
  uint *puVar125;
  uint uVar126;
  uint uVar127;
  uint uVar128;
  long lVar129;
  uint uVar130;
  long lVar131;
  long in_FS_OFFSET;
  ulong uVar132;
  short sVar133;
  short sVar136;
  double dVar134;
  double dVar135;
  ushort uVar137;
  ushort uVar151;
  double dVar138;
  byte bVar152;
  undefined1 auVar139 [12];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar140 [12];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  double dVar153;
  byte bVar156;
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  short sVar157;
  short sVar160;
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  double dVar161;
  double dVar168;
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined4 uVar169;
  double dVar170;
  ulong uVar171;
  undefined1 auVar173 [12];
  double dVar176;
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [12];
  int fx;
  uint *end;
  uint local_40;
  uint local_3c;
  long local_38;
  undefined1 auVar141 [16];
  undefined1 auVar147 [16];
  undefined1 auVar172 [12];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar183 [16];
  
  uVar132 = (ulong)(uint)y;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  dVar170 = (double)x + 0.5;
  dVar176 = (double)y + 0.5;
  end = buffer + length;
  if ((data->field_0x8a & 1) != 0) {
    dVar135 = data->m12;
    dVar161 = (dVar176 * data->m21 + dVar170 * data->m11 + data->dx) * 65536.0;
    dVar168 = (dVar176 * data->m22 + dVar170 * dVar135 + data->dy) * 65536.0;
    dVar138 = dVar168;
    if (dVar161 <= dVar168) {
      dVar138 = dVar161;
    }
    dVar134 = trunc(data->m11 * 65536.0);
    dVar135 = trunc(dVar135 * 65536.0);
    dVar153 = (double)length * dVar134 + dVar161;
    dVar134 = (double)length * dVar135 + dVar168;
    dVar135 = dVar134;
    if (dVar153 <= dVar134) {
      dVar135 = dVar153;
    }
    if (dVar138 <= dVar135) {
      dVar135 = dVar138;
    }
    if (-2147483648.0 <= dVar135) {
      if (dVar168 <= dVar161) {
        dVar168 = dVar161;
      }
      if (dVar134 <= dVar153) {
        dVar134 = dVar153;
      }
      if (dVar134 <= dVar168) {
        dVar134 = dVar168;
      }
      if (dVar134 <= 2147483647.0) {
        dVar135 = data->m11;
        uVar126 = (uint)(dVar135 * 65536.0);
        iVar123 = (int)(data->m12 * 65536.0);
        dVar168 = data->m22;
        local_3c = (int)((data->m21 * dVar176 + dVar170 * dVar135 + data->dx) * 65536.0) - 0x8000;
        local_40 = (int)((dVar176 * dVar168 + dVar170 * data->m12 + data->dy) * 65536.0) - 0x8000;
        if (iVar123 != 0) {
          uVar132 = -(ulong)(dVar135 < -dVar135);
          if (((double)(~uVar132 & (ulong)dVar135 | (ulong)-dVar135 & uVar132) < 0.125) ||
             (uVar132 = -(ulong)(dVar168 < -dVar168),
             (double)(~uVar132 & (ulong)dVar168 | (ulong)-dVar168 & uVar132) < 0.125)) {
            if (0 < length) {
              puVar4 = (data->field_23).texture.imageData;
              lVar129 = (data->field_23).texture.bytesPerLine;
              puVar125 = buffer;
              do {
                uVar128 = (data->field_23).texture.width;
                uVar119 = (data->field_23).texture.height;
                iVar118 = (int)(CONCAT44((int)local_3c >> 0x1f,(int)local_3c >> 0x10) %
                               (long)(int)uVar128);
                uVar127 = iVar118 >> 0x1f & uVar128;
                uVar130 = uVar127 + iVar118 + 1;
                if (uVar130 == uVar128) {
                  uVar130 = 0;
                }
                iVar121 = (int)(CONCAT44((int)local_40 >> 0x1f,(int)local_40 >> 0x10) %
                               (long)(int)uVar119);
                uVar117 = iVar121 >> 0x1f & uVar119;
                uVar128 = uVar117 + iVar121 + 1;
                if (uVar128 == uVar119) {
                  uVar128 = 0;
                }
                lVar120 = (int)(uVar117 + iVar121) * lVar129;
                lVar122 = (long)(int)(uVar127 + iVar118);
                uVar169 = *(undefined4 *)(puVar4 + lVar122 * 4 + lVar120);
                uVar119 = *(uint *)(puVar4 + (long)(int)uVar130 * 4 + lVar120);
                lVar120 = (int)uVar128 * lVar129;
                uVar1 = *(undefined4 *)(puVar4 + (long)(int)uVar130 * 4 + lVar120);
                uVar2 = *(undefined4 *)(puVar4 + lVar122 * 4 + lVar120);
                uVar128 = local_40 >> 8 & 0xff;
                uVar127 = local_3c >> 8 & 0xff;
                uVar132 = CONCAT44(uVar119,uVar169);
                bVar152 = (byte)(uVar119 >> 0x18);
                auVar33._8_6_ = 0;
                auVar33._0_8_ = uVar132;
                auVar33[0xe] = bVar152;
                auVar39._8_4_ = 0;
                auVar39._0_8_ = uVar132;
                auVar39[0xc] = (char)(uVar119 >> 0x10);
                auVar39._13_2_ = auVar33._13_2_;
                auVar45._8_4_ = 0;
                auVar45._0_8_ = uVar132;
                auVar45._12_3_ = auVar39._12_3_;
                auVar51._8_2_ = 0;
                auVar51._0_8_ = uVar132;
                auVar51[10] = (char)(uVar119 >> 8);
                auVar51._11_4_ = auVar45._11_4_;
                auVar57._8_2_ = 0;
                auVar57._0_8_ = uVar132;
                auVar57._10_5_ = auVar51._10_5_;
                auVar63[8] = (char)uVar119;
                auVar63._0_8_ = uVar132;
                auVar63._9_6_ = auVar57._9_6_;
                auVar75._7_8_ = 0;
                auVar75._0_7_ = auVar63._8_7_;
                Var76 = CONCAT81(SUB158(auVar75 << 0x40,7),(char)((uint)uVar169 >> 0x18));
                auVar107._9_6_ = 0;
                auVar107._0_9_ = Var76;
                auVar69[4] = (char)((uint)uVar169 >> 0x10);
                auVar69._0_4_ = uVar169;
                auVar69._5_10_ = SUB1510(auVar107 << 0x30,5);
                auVar77._11_4_ = 0;
                auVar77._0_11_ = auVar69._4_11_;
                auVar78._1_12_ = SUB1512(auVar77 << 0x20,3);
                auVar78[0] = (char)((uint)uVar169 >> 8);
                auVar143._0_2_ = CONCAT11(0,(byte)uVar169);
                auVar143._2_13_ = auVar78;
                auVar143[0xf] = 0;
                uVar132 = CONCAT44(uVar1,uVar2);
                auVar158 = pshuflw(ZEXT416(uVar119),ZEXT416(0x100 - uVar128),0);
                sVar157 = auVar158._0_2_;
                sVar160 = auVar158._2_2_;
                bVar156 = (byte)((uint)uVar1 >> 0x18);
                auVar34._8_6_ = 0;
                auVar34._0_8_ = uVar132;
                auVar34[0xe] = bVar156;
                auVar40._8_4_ = 0;
                auVar40._0_8_ = uVar132;
                auVar40[0xc] = (char)((uint)uVar1 >> 0x10);
                auVar40._13_2_ = auVar34._13_2_;
                auVar46._8_4_ = 0;
                auVar46._0_8_ = uVar132;
                auVar46._12_3_ = auVar40._12_3_;
                auVar52._8_2_ = 0;
                auVar52._0_8_ = uVar132;
                auVar52[10] = (char)((uint)uVar1 >> 8);
                auVar52._11_4_ = auVar46._11_4_;
                auVar58._8_2_ = 0;
                auVar58._0_8_ = uVar132;
                auVar58._10_5_ = auVar52._10_5_;
                auVar64[8] = (char)uVar1;
                auVar64._0_8_ = uVar132;
                auVar64._9_6_ = auVar58._9_6_;
                auVar79._7_8_ = 0;
                auVar79._0_7_ = auVar64._8_7_;
                Var80 = CONCAT81(SUB158(auVar79 << 0x40,7),(char)((uint)uVar2 >> 0x18));
                auVar108._9_6_ = 0;
                auVar108._0_9_ = Var80;
                auVar70[4] = (char)((uint)uVar2 >> 0x10);
                auVar70._0_4_ = uVar2;
                auVar70._5_10_ = SUB1510(auVar108 << 0x30,5);
                auVar81._11_4_ = 0;
                auVar81._0_11_ = auVar70._4_11_;
                auVar82._1_12_ = SUB1512(auVar81 << 0x20,3);
                auVar82[0] = (char)((uint)uVar2 >> 8);
                auVar158 = pshuflw(auVar143,ZEXT416(uVar128),0);
                sVar133 = auVar158._0_2_;
                sVar136 = auVar158._2_2_;
                auVar142._0_4_ =
                     CONCAT22(sVar136 * auVar82._0_2_ + sVar160 * auVar78._0_2_,
                              sVar133 * (ushort)(byte)uVar2 + sVar157 * auVar143._0_2_);
                auVar139._0_8_ =
                     CONCAT26(sVar136 * (short)Var80 + sVar160 * (short)Var76,
                              CONCAT24(sVar133 * auVar70._4_2_ + sVar157 * auVar69._4_2_,
                                       auVar142._0_4_));
                auVar139._8_2_ = sVar133 * auVar64._8_2_ + sVar157 * auVar63._8_2_;
                auVar139._10_2_ = sVar136 * auVar52._10_2_ + sVar160 * auVar51._10_2_;
                auVar141._12_2_ = sVar133 * auVar40._12_2_ + sVar157 * auVar39._12_2_;
                auVar141._0_12_ = auVar139;
                auVar141._14_2_ = sVar136 * (ushort)bVar156 + sVar160 * (ushort)bVar152;
                uVar169 = CONCAT22((short)uVar127,(short)(0x100 - uVar127));
                auVar142._12_4_ = auVar141._12_4_;
                auVar142._4_4_ = auVar139._8_4_;
                auVar142._8_4_ = (int)((ulong)auVar139._0_8_ >> 0x20);
                auVar143 = pshuflw(auVar142,auVar142,0xd8);
                auVar154._4_4_ = uVar169;
                auVar154._0_4_ = uVar169;
                auVar154._8_4_ = uVar169;
                auVar154._12_4_ = uVar169;
                auVar143 = pshufhw(auVar143,auVar143,0xd8);
                auVar144._0_2_ = auVar143._0_2_ >> 8;
                auVar144._2_2_ = auVar143._2_2_ >> 8;
                auVar144._4_2_ = auVar143._4_2_ >> 8;
                auVar144._6_2_ = auVar143._6_2_ >> 8;
                auVar144._8_2_ = auVar143._8_2_ >> 8;
                auVar144._10_2_ = auVar143._10_2_ >> 8;
                auVar144._12_2_ = auVar143._12_2_ >> 8;
                auVar144._14_2_ = auVar143._14_2_ >> 8;
                auVar143 = pmaddwd(auVar144,auVar154);
                auVar145._0_4_ = auVar143._0_4_ >> 8;
                auVar145._4_4_ = auVar143._4_4_ >> 8;
                auVar145._8_4_ = auVar143._8_4_ >> 8;
                auVar145._12_4_ = auVar143._12_4_ >> 8;
                auVar143 = packssdw(auVar145,auVar145);
                sVar133 = auVar143._0_2_;
                sVar136 = auVar143._2_2_;
                sVar157 = auVar143._4_2_;
                sVar160 = auVar143._6_2_;
                local_3c = local_3c + uVar126;
                *puVar125 = CONCAT13((0 < sVar160) * (sVar160 < 0x100) * auVar143[6] -
                                     (0xff < sVar160),
                                     CONCAT12((0 < sVar157) * (sVar157 < 0x100) * auVar143[4] -
                                              (0xff < sVar157),
                                              CONCAT11((0 < sVar136) * (sVar136 < 0x100) *
                                                       auVar143[2] - (0xff < sVar136),
                                                       (0 < sVar133) * (sVar133 < 0x100) *
                                                       auVar143[0] - (0xff < sVar133))));
                local_40 = local_40 + iVar123;
                puVar125 = puVar125 + 1;
              } while (puVar125 < end);
            }
          }
          else if (0 < length) {
            puVar4 = (data->field_23).texture.imageData;
            lVar129 = (data->field_23).texture.bytesPerLine;
            puVar125 = buffer;
            do {
              uVar128 = (data->field_23).texture.width;
              uVar119 = (data->field_23).texture.height;
              iVar118 = (int)(CONCAT44((int)local_3c >> 0x1f,(int)local_3c >> 0x10) %
                             (long)(int)uVar128);
              uVar130 = iVar118 >> 0x1f & uVar128;
              uVar127 = uVar130 + iVar118 + 1;
              if (uVar127 == uVar128) {
                uVar127 = 0;
              }
              iVar121 = (int)(CONCAT44((int)local_40 >> 0x1f,(int)local_40 >> 0x10) %
                             (long)(int)uVar119);
              uVar117 = iVar121 >> 0x1f & uVar119;
              uVar128 = uVar117 + iVar121 + 1;
              if (uVar128 == uVar119) {
                uVar128 = 0;
              }
              lVar120 = (int)(uVar117 + iVar121) * lVar129;
              lVar122 = (long)(int)(uVar130 + iVar118);
              uVar169 = *(undefined4 *)(puVar4 + lVar122 * 4 + lVar120);
              uVar119 = *(uint *)(puVar4 + (long)(int)uVar127 * 4 + lVar120);
              lVar120 = (int)uVar128 * lVar129;
              uVar1 = *(undefined4 *)(puVar4 + (long)(int)uVar127 * 4 + lVar120);
              uVar2 = *(undefined4 *)(puVar4 + lVar122 * 4 + lVar120);
              uVar128 = local_40 >> 8 & 0xff;
              uVar127 = local_3c >> 8 & 0xff;
              uVar132 = CONCAT44(uVar119,uVar169);
              bVar152 = (byte)(uVar119 >> 0x18);
              auVar37._8_6_ = 0;
              auVar37._0_8_ = uVar132;
              auVar37[0xe] = bVar152;
              auVar43._8_4_ = 0;
              auVar43._0_8_ = uVar132;
              auVar43[0xc] = (char)(uVar119 >> 0x10);
              auVar43._13_2_ = auVar37._13_2_;
              auVar49._8_4_ = 0;
              auVar49._0_8_ = uVar132;
              auVar49._12_3_ = auVar43._12_3_;
              auVar55._8_2_ = 0;
              auVar55._0_8_ = uVar132;
              auVar55[10] = (char)(uVar119 >> 8);
              auVar55._11_4_ = auVar49._11_4_;
              auVar61._8_2_ = 0;
              auVar61._0_8_ = uVar132;
              auVar61._10_5_ = auVar55._10_5_;
              auVar67[8] = (char)uVar119;
              auVar67._0_8_ = uVar132;
              auVar67._9_6_ = auVar61._9_6_;
              auVar89._7_8_ = 0;
              auVar89._0_7_ = auVar67._8_7_;
              Var76 = CONCAT81(SUB158(auVar89 << 0x40,7),(char)((uint)uVar169 >> 0x18));
              auVar111._9_6_ = 0;
              auVar111._0_9_ = Var76;
              auVar73[4] = (char)((uint)uVar169 >> 0x10);
              auVar73._0_4_ = uVar169;
              auVar73._5_10_ = SUB1510(auVar111 << 0x30,5);
              auVar90._11_4_ = 0;
              auVar90._0_11_ = auVar73._4_11_;
              auVar91._1_12_ = SUB1512(auVar90 << 0x20,3);
              auVar91[0] = (char)((uint)uVar169 >> 8);
              auVar146._0_2_ = CONCAT11(0,(byte)uVar169);
              auVar146._2_13_ = auVar91;
              auVar146[0xf] = 0;
              uVar132 = CONCAT44(uVar1,uVar2);
              auVar143 = pshuflw(ZEXT416(uVar119),ZEXT416(0x100 - uVar128),0);
              sVar157 = auVar143._0_2_;
              sVar160 = auVar143._2_2_;
              bVar156 = (byte)((uint)uVar1 >> 0x18);
              auVar38._8_6_ = 0;
              auVar38._0_8_ = uVar132;
              auVar38[0xe] = bVar156;
              auVar44._8_4_ = 0;
              auVar44._0_8_ = uVar132;
              auVar44[0xc] = (char)((uint)uVar1 >> 0x10);
              auVar44._13_2_ = auVar38._13_2_;
              auVar50._8_4_ = 0;
              auVar50._0_8_ = uVar132;
              auVar50._12_3_ = auVar44._12_3_;
              auVar56._8_2_ = 0;
              auVar56._0_8_ = uVar132;
              auVar56[10] = (char)((uint)uVar1 >> 8);
              auVar56._11_4_ = auVar50._11_4_;
              auVar62._8_2_ = 0;
              auVar62._0_8_ = uVar132;
              auVar62._10_5_ = auVar56._10_5_;
              auVar68[8] = (char)uVar1;
              auVar68._0_8_ = uVar132;
              auVar68._9_6_ = auVar62._9_6_;
              auVar92._7_8_ = 0;
              auVar92._0_7_ = auVar68._8_7_;
              Var80 = CONCAT81(SUB158(auVar92 << 0x40,7),(char)((uint)uVar2 >> 0x18));
              auVar112._9_6_ = 0;
              auVar112._0_9_ = Var80;
              auVar74[4] = (char)((uint)uVar2 >> 0x10);
              auVar74._0_4_ = uVar2;
              auVar74._5_10_ = SUB1510(auVar112 << 0x30,5);
              auVar93._11_4_ = 0;
              auVar93._0_11_ = auVar74._4_11_;
              auVar94._1_12_ = SUB1512(auVar93 << 0x20,3);
              auVar94[0] = (char)((uint)uVar2 >> 8);
              auVar143 = pshuflw(auVar146,ZEXT416(uVar128),0);
              sVar133 = auVar143._0_2_;
              sVar136 = auVar143._2_2_;
              auVar148._0_4_ =
                   CONCAT22(sVar136 * auVar94._0_2_ + sVar160 * auVar91._0_2_,
                            sVar133 * (ushort)(byte)uVar2 + sVar157 * auVar146._0_2_);
              auVar140._0_8_ =
                   CONCAT26(sVar136 * (short)Var80 + sVar160 * (short)Var76,
                            CONCAT24(sVar133 * auVar74._4_2_ + sVar157 * auVar73._4_2_,
                                     auVar148._0_4_));
              auVar140._8_2_ = sVar133 * auVar68._8_2_ + sVar157 * auVar67._8_2_;
              auVar140._10_2_ = sVar136 * auVar56._10_2_ + sVar160 * auVar55._10_2_;
              auVar147._12_2_ = sVar133 * auVar44._12_2_ + sVar157 * auVar43._12_2_;
              auVar147._0_12_ = auVar140;
              auVar147._14_2_ = sVar136 * (ushort)bVar156 + sVar160 * (ushort)bVar152;
              uVar169 = CONCAT22((short)uVar127,(short)(0x100 - uVar127));
              auVar148._12_4_ = auVar147._12_4_;
              auVar148._4_4_ = auVar140._8_4_;
              auVar148._8_4_ = (int)((ulong)auVar140._0_8_ >> 0x20);
              auVar143 = pshuflw(auVar148,auVar148,0xd8);
              auVar155._4_4_ = uVar169;
              auVar155._0_4_ = uVar169;
              auVar155._8_4_ = uVar169;
              auVar155._12_4_ = uVar169;
              auVar143 = pshufhw(auVar143,auVar143,0xd8);
              auVar149._0_2_ = auVar143._0_2_ >> 8;
              auVar149._2_2_ = auVar143._2_2_ >> 8;
              auVar149._4_2_ = auVar143._4_2_ >> 8;
              auVar149._6_2_ = auVar143._6_2_ >> 8;
              auVar149._8_2_ = auVar143._8_2_ >> 8;
              auVar149._10_2_ = auVar143._10_2_ >> 8;
              auVar149._12_2_ = auVar143._12_2_ >> 8;
              auVar149._14_2_ = auVar143._14_2_ >> 8;
              auVar143 = pmaddwd(auVar149,auVar155);
              auVar150._0_4_ = auVar143._0_4_ >> 8;
              auVar150._4_4_ = auVar143._4_4_ >> 8;
              auVar150._8_4_ = auVar143._8_4_ >> 8;
              auVar150._12_4_ = auVar143._12_4_ >> 8;
              auVar143 = packssdw(auVar150,auVar150);
              sVar133 = auVar143._0_2_;
              sVar136 = auVar143._2_2_;
              sVar157 = auVar143._4_2_;
              sVar160 = auVar143._6_2_;
              local_3c = local_3c + uVar126;
              *puVar125 = CONCAT13((0 < sVar160) * (sVar160 < 0x100) * auVar143[6] -
                                   (0xff < sVar160),
                                   CONCAT12((0 < sVar157) * (sVar157 < 0x100) * auVar143[4] -
                                            (0xff < sVar157),
                                            CONCAT11((0 < sVar136) * (sVar136 < 0x100) * auVar143[2]
                                                     - (0xff < sVar136),
                                                     (0 < sVar133) * (sVar133 < 0x100) * auVar143[0]
                                                     - (0xff < sVar133))));
              local_40 = local_40 + iVar123;
              puVar125 = puVar125 + 1;
            } while (puVar125 < end);
          }
          goto LAB_00669687;
        }
        uVar128 = -uVar126;
        if (0 < (int)uVar126) {
          uVar128 = uVar126;
        }
        puVar125 = buffer;
        if (0x10000 < uVar128) {
          if (0x20000 < uVar128) {
            uVar128 = (data->field_23).texture.height;
            iVar123 = ((int)local_40 >> 0x10) % (int)uVar128;
            uVar127 = iVar123 >> 0x1f & uVar128;
            uVar130 = uVar127 + iVar123 + 1;
            uVar132 = -(ulong)(dVar168 < -dVar168);
            uVar119 = 0;
            if (uVar130 != uVar128) {
              uVar119 = uVar130;
            }
            puVar4 = (data->field_23).texture.imageData;
            lVar129 = (data->field_23).texture.bytesPerLine;
            lVar120 = (int)(uVar127 + iVar123) * lVar129;
            lVar129 = (int)uVar119 * lVar129;
            if (0.125 <= (double)(~uVar132 & (ulong)dVar168 | (ulong)-dVar168 & uVar132)) {
              if (0 < length) {
                auVar143 = ZEXT416(0x100 - (local_40 >> 8 & 0xff));
                auVar143 = pshuflw(auVar143,auVar143,0);
                auVar158 = pshuflw(ZEXT416(local_40),ZEXT416(local_40),0);
                uVar137 = auVar158._0_2_;
                uVar151 = auVar158._2_2_;
                do {
                  uVar128 = (data->field_23).texture.width;
                  iVar123 = (int)(CONCAT44((int)local_3c >> 0x1f,(int)local_3c >> 0x10) %
                                 (long)(int)uVar128);
                  uVar127 = iVar123 >> 0x1f & uVar128;
                  uVar119 = uVar127 + iVar123 + 1;
                  if (uVar119 == uVar128) {
                    uVar119 = 0;
                  }
                  lVar122 = (long)(int)(uVar127 + iVar123);
                  uVar128 = local_3c >> 8 & 0xff;
                  uVar169 = *(undefined4 *)(puVar4 + (long)(int)uVar119 * 4 + lVar120);
                  uVar1 = *(undefined4 *)(puVar4 + lVar122 * 4 + lVar120);
                  uVar132 = CONCAT44(uVar169,uVar1);
                  uVar2 = *(undefined4 *)(puVar4 + (long)(int)uVar119 * 4 + lVar129);
                  uVar3 = *(undefined4 *)(puVar4 + lVar122 * 4 + lVar129);
                  uVar171 = CONCAT44(uVar2,uVar3);
                  auVar7._8_6_ = 0;
                  auVar7._0_8_ = uVar132;
                  auVar7[0xe] = (char)((uint)uVar169 >> 0x18);
                  auVar11._8_4_ = 0;
                  auVar11._0_8_ = uVar132;
                  auVar11[0xc] = (char)((uint)uVar169 >> 0x10);
                  auVar11._13_2_ = auVar7._13_2_;
                  auVar15._8_4_ = 0;
                  auVar15._0_8_ = uVar132;
                  auVar15._12_3_ = auVar11._12_3_;
                  auVar19._8_2_ = 0;
                  auVar19._0_8_ = uVar132;
                  auVar19[10] = (char)((uint)uVar169 >> 8);
                  auVar19._11_4_ = auVar15._11_4_;
                  auVar23._8_2_ = 0;
                  auVar23._0_8_ = uVar132;
                  auVar23._10_5_ = auVar19._10_5_;
                  auVar27[8] = (char)uVar169;
                  auVar27._0_8_ = uVar132;
                  auVar27._9_6_ = auVar23._9_6_;
                  auVar101._7_8_ = 0;
                  auVar101._0_7_ = auVar27._8_7_;
                  Var76 = CONCAT81(SUB158(auVar101 << 0x40,7),(char)((uint)uVar1 >> 0x18));
                  auVar115._9_6_ = 0;
                  auVar115._0_9_ = Var76;
                  auVar31[4] = (char)((uint)uVar1 >> 0x10);
                  auVar31._0_4_ = uVar1;
                  auVar31._5_10_ = SUB1510(auVar115 << 0x30,5);
                  auVar102._11_4_ = 0;
                  auVar102._0_11_ = auVar31._4_11_;
                  auVar103._1_12_ = SUB1512(auVar102 << 0x20,3);
                  auVar103[0] = (char)((uint)uVar1 >> 8);
                  sVar133 = auVar143._0_2_;
                  sVar136 = auVar143._2_2_;
                  auVar8._8_6_ = 0;
                  auVar8._0_8_ = uVar171;
                  auVar8[0xe] = (char)((uint)uVar2 >> 0x18);
                  auVar12._8_4_ = 0;
                  auVar12._0_8_ = uVar171;
                  auVar12[0xc] = (char)((uint)uVar2 >> 0x10);
                  auVar12._13_2_ = auVar8._13_2_;
                  auVar16._8_4_ = 0;
                  auVar16._0_8_ = uVar171;
                  auVar16._12_3_ = auVar12._12_3_;
                  auVar20._8_2_ = 0;
                  auVar20._0_8_ = uVar171;
                  auVar20[10] = (char)((uint)uVar2 >> 8);
                  auVar20._11_4_ = auVar16._11_4_;
                  auVar24._8_2_ = 0;
                  auVar24._0_8_ = uVar171;
                  auVar24._10_5_ = auVar20._10_5_;
                  auVar28[8] = (char)uVar2;
                  auVar28._0_8_ = uVar171;
                  auVar28._9_6_ = auVar24._9_6_;
                  auVar104._7_8_ = 0;
                  auVar104._0_7_ = auVar28._8_7_;
                  Var80 = CONCAT81(SUB158(auVar104 << 0x40,7),(char)((uint)uVar3 >> 0x18));
                  auVar116._9_6_ = 0;
                  auVar116._0_9_ = Var80;
                  auVar32[4] = (char)((uint)uVar3 >> 0x10);
                  auVar32._0_4_ = uVar3;
                  auVar32._5_10_ = SUB1510(auVar116 << 0x30,5);
                  auVar105._11_4_ = 0;
                  auVar105._0_11_ = auVar32._4_11_;
                  auVar106._1_12_ = SUB1512(auVar105 << 0x20,3);
                  auVar106[0] = (char)((uint)uVar3 >> 8);
                  uVar169 = CONCAT22(auVar106._0_2_ * (uVar151 >> 8) + auVar103._0_2_ * sVar136,
                                     (ushort)(byte)uVar3 * (uVar137 >> 8) +
                                     (ushort)(byte)uVar1 * sVar133);
                  auVar173._0_8_ =
                       CONCAT26((short)Var80 * (uVar151 >> 8) + (short)Var76 * sVar136,
                                CONCAT24(auVar32._4_2_ * (uVar137 >> 8) + auVar31._4_2_ * sVar133,
                                         uVar169));
                  auVar173._8_2_ = auVar28._8_2_ * (uVar137 >> 8) + auVar27._8_2_ * sVar133;
                  auVar173._10_2_ = auVar20._10_2_ * (uVar151 >> 8) + auVar19._10_2_ * sVar136;
                  auVar175._12_2_ = auVar12._12_2_ * (uVar137 >> 8) + auVar11._12_2_ * sVar133;
                  auVar175._0_12_ = auVar173;
                  auVar175._14_2_ =
                       (auVar8._13_2_ >> 8) * (uVar151 >> 8) + (auVar7._13_2_ >> 8) * sVar136;
                  auVar158._0_4_ = CONCAT22((short)uVar128,(short)(0x100 - uVar128));
                  auVar158._4_4_ = auVar158._0_4_;
                  auVar158._8_4_ = auVar158._0_4_;
                  auVar158._12_4_ = auVar158._0_4_;
                  auVar165._4_4_ = auVar173._8_4_;
                  auVar165._0_4_ = uVar169;
                  auVar165._8_4_ = (int)((ulong)auVar173._0_8_ >> 0x20);
                  auVar165._12_4_ = auVar175._12_4_;
                  auVar165 = pshuflw(auVar165,auVar165,0xd8);
                  auVar165 = pshufhw(auVar165,auVar165,0xd8);
                  auVar166._0_2_ = auVar165._0_2_ >> 8;
                  auVar166._2_2_ = auVar165._2_2_ >> 8;
                  auVar166._4_2_ = auVar165._4_2_ >> 8;
                  auVar166._6_2_ = auVar165._6_2_ >> 8;
                  auVar166._8_2_ = auVar165._8_2_ >> 8;
                  auVar166._10_2_ = auVar165._10_2_ >> 8;
                  auVar166._12_2_ = auVar165._12_2_ >> 8;
                  auVar166._14_2_ = auVar165._14_2_ >> 8;
                  auVar158 = pmaddwd(auVar166,auVar158);
                  auVar167._0_4_ = auVar158._0_4_ >> 8;
                  auVar167._4_4_ = auVar158._4_4_ >> 8;
                  auVar167._8_4_ = auVar158._8_4_ >> 8;
                  auVar167._12_4_ = auVar158._12_4_ >> 8;
                  auVar158 = packssdw(auVar167,auVar167);
                  sVar133 = auVar158._0_2_;
                  sVar136 = auVar158._2_2_;
                  sVar157 = auVar158._4_2_;
                  sVar160 = auVar158._6_2_;
                  *puVar125 = CONCAT13((0 < sVar160) * (sVar160 < 0x100) * auVar158[6] -
                                       (0xff < sVar160),
                                       CONCAT12((0 < sVar157) * (sVar157 < 0x100) * auVar158[4] -
                                                (0xff < sVar157),
                                                CONCAT11((0 < sVar136) * (sVar136 < 0x100) *
                                                         auVar158[2] - (0xff < sVar136),
                                                         (0 < sVar133) * (sVar133 < 0x100) *
                                                         auVar158[0] - (0xff < sVar133))));
                  local_3c = local_3c + uVar126;
                  puVar125 = puVar125 + 1;
                } while (puVar125 < end);
              }
            }
            else if (0 < length) {
              auVar143 = ZEXT416(0x100 - (local_40 >> 8 & 0xff));
              auVar143 = pshuflw(auVar143,auVar143,0);
              auVar158 = pshuflw(ZEXT416(local_40),ZEXT416(local_40),0);
              uVar137 = auVar158._0_2_;
              uVar151 = auVar158._2_2_;
              do {
                uVar128 = (data->field_23).texture.width;
                iVar123 = (int)(CONCAT44((int)local_3c >> 0x1f,(int)local_3c >> 0x10) %
                               (long)(int)uVar128);
                uVar127 = iVar123 >> 0x1f & uVar128;
                uVar119 = uVar127 + iVar123 + 1;
                if (uVar119 == uVar128) {
                  uVar119 = 0;
                }
                lVar122 = (long)(int)(uVar127 + iVar123);
                uVar128 = local_3c >> 8 & 0xff;
                uVar169 = *(undefined4 *)(puVar4 + (long)(int)uVar119 * 4 + lVar120);
                uVar1 = *(undefined4 *)(puVar4 + lVar122 * 4 + lVar120);
                uVar132 = CONCAT44(uVar169,uVar1);
                uVar2 = *(undefined4 *)(puVar4 + (long)(int)uVar119 * 4 + lVar129);
                uVar3 = *(undefined4 *)(puVar4 + lVar122 * 4 + lVar129);
                uVar171 = CONCAT44(uVar2,uVar3);
                auVar5._8_6_ = 0;
                auVar5._0_8_ = uVar132;
                auVar5[0xe] = (char)((uint)uVar169 >> 0x18);
                auVar9._8_4_ = 0;
                auVar9._0_8_ = uVar132;
                auVar9[0xc] = (char)((uint)uVar169 >> 0x10);
                auVar9._13_2_ = auVar5._13_2_;
                auVar13._8_4_ = 0;
                auVar13._0_8_ = uVar132;
                auVar13._12_3_ = auVar9._12_3_;
                auVar17._8_2_ = 0;
                auVar17._0_8_ = uVar132;
                auVar17[10] = (char)((uint)uVar169 >> 8);
                auVar17._11_4_ = auVar13._11_4_;
                auVar21._8_2_ = 0;
                auVar21._0_8_ = uVar132;
                auVar21._10_5_ = auVar17._10_5_;
                auVar25[8] = (char)uVar169;
                auVar25._0_8_ = uVar132;
                auVar25._9_6_ = auVar21._9_6_;
                auVar95._7_8_ = 0;
                auVar95._0_7_ = auVar25._8_7_;
                Var76 = CONCAT81(SUB158(auVar95 << 0x40,7),(char)((uint)uVar1 >> 0x18));
                auVar113._9_6_ = 0;
                auVar113._0_9_ = Var76;
                auVar29[4] = (char)((uint)uVar1 >> 0x10);
                auVar29._0_4_ = uVar1;
                auVar29._5_10_ = SUB1510(auVar113 << 0x30,5);
                auVar96._11_4_ = 0;
                auVar96._0_11_ = auVar29._4_11_;
                auVar97._1_12_ = SUB1512(auVar96 << 0x20,3);
                auVar97[0] = (char)((uint)uVar1 >> 8);
                sVar133 = auVar143._0_2_;
                sVar136 = auVar143._2_2_;
                auVar6._8_6_ = 0;
                auVar6._0_8_ = uVar171;
                auVar6[0xe] = (char)((uint)uVar2 >> 0x18);
                auVar10._8_4_ = 0;
                auVar10._0_8_ = uVar171;
                auVar10[0xc] = (char)((uint)uVar2 >> 0x10);
                auVar10._13_2_ = auVar6._13_2_;
                auVar14._8_4_ = 0;
                auVar14._0_8_ = uVar171;
                auVar14._12_3_ = auVar10._12_3_;
                auVar18._8_2_ = 0;
                auVar18._0_8_ = uVar171;
                auVar18[10] = (char)((uint)uVar2 >> 8);
                auVar18._11_4_ = auVar14._11_4_;
                auVar22._8_2_ = 0;
                auVar22._0_8_ = uVar171;
                auVar22._10_5_ = auVar18._10_5_;
                auVar26[8] = (char)uVar2;
                auVar26._0_8_ = uVar171;
                auVar26._9_6_ = auVar22._9_6_;
                auVar98._7_8_ = 0;
                auVar98._0_7_ = auVar26._8_7_;
                Var80 = CONCAT81(SUB158(auVar98 << 0x40,7),(char)((uint)uVar3 >> 0x18));
                auVar114._9_6_ = 0;
                auVar114._0_9_ = Var80;
                auVar30[4] = (char)((uint)uVar3 >> 0x10);
                auVar30._0_4_ = uVar3;
                auVar30._5_10_ = SUB1510(auVar114 << 0x30,5);
                auVar99._11_4_ = 0;
                auVar99._0_11_ = auVar30._4_11_;
                auVar100._1_12_ = SUB1512(auVar99 << 0x20,3);
                auVar100[0] = (char)((uint)uVar3 >> 8);
                uVar169 = CONCAT22(auVar100._0_2_ * (uVar151 >> 8) + auVar97._0_2_ * sVar136,
                                   (ushort)(byte)uVar3 * (uVar137 >> 8) +
                                   (ushort)(byte)uVar1 * sVar133);
                auVar172._0_8_ =
                     CONCAT26((short)Var80 * (uVar151 >> 8) + (short)Var76 * sVar136,
                              CONCAT24(auVar30._4_2_ * (uVar137 >> 8) + auVar29._4_2_ * sVar133,
                                       uVar169));
                auVar172._8_2_ = auVar26._8_2_ * (uVar137 >> 8) + auVar25._8_2_ * sVar133;
                auVar172._10_2_ = auVar18._10_2_ * (uVar151 >> 8) + auVar17._10_2_ * sVar136;
                auVar174._12_2_ = auVar10._12_2_ * (uVar137 >> 8) + auVar9._12_2_ * sVar133;
                auVar174._0_12_ = auVar172;
                auVar174._14_2_ =
                     (auVar6._13_2_ >> 8) * (uVar151 >> 8) + (auVar5._13_2_ >> 8) * sVar136;
                auVar159._0_4_ = CONCAT22((short)uVar128,(short)(0x100 - uVar128));
                auVar159._4_4_ = auVar159._0_4_;
                auVar159._8_4_ = auVar159._0_4_;
                auVar159._12_4_ = auVar159._0_4_;
                auVar162._4_4_ = auVar172._8_4_;
                auVar162._0_4_ = uVar169;
                auVar162._8_4_ = (int)((ulong)auVar172._0_8_ >> 0x20);
                auVar162._12_4_ = auVar174._12_4_;
                auVar158 = pshuflw(auVar162,auVar162,0xd8);
                auVar158 = pshufhw(auVar158,auVar158,0xd8);
                auVar163._0_2_ = auVar158._0_2_ >> 8;
                auVar163._2_2_ = auVar158._2_2_ >> 8;
                auVar163._4_2_ = auVar158._4_2_ >> 8;
                auVar163._6_2_ = auVar158._6_2_ >> 8;
                auVar163._8_2_ = auVar158._8_2_ >> 8;
                auVar163._10_2_ = auVar158._10_2_ >> 8;
                auVar163._12_2_ = auVar158._12_2_ >> 8;
                auVar163._14_2_ = auVar158._14_2_ >> 8;
                auVar158 = pmaddwd(auVar163,auVar159);
                auVar164._0_4_ = auVar158._0_4_ >> 8;
                auVar164._4_4_ = auVar158._4_4_ >> 8;
                auVar164._8_4_ = auVar158._8_4_ >> 8;
                auVar164._12_4_ = auVar158._12_4_ >> 8;
                auVar158 = packssdw(auVar164,auVar164);
                sVar133 = auVar158._0_2_;
                sVar136 = auVar158._2_2_;
                sVar157 = auVar158._4_2_;
                sVar160 = auVar158._6_2_;
                *puVar125 = CONCAT13((0 < sVar160) * (sVar160 < 0x100) * auVar158[6] -
                                     (0xff < sVar160),
                                     CONCAT12((0 < sVar157) * (sVar157 < 0x100) * auVar158[4] -
                                              (0xff < sVar157),
                                              CONCAT11((0 < sVar136) * (sVar136 < 0x100) *
                                                       auVar158[2] - (0xff < sVar136),
                                                       (0 < sVar133) * (sVar133 < 0x100) *
                                                       auVar158[0] - (0xff < sVar133))));
                local_3c = local_3c + uVar126;
                puVar125 = puVar125 + 1;
              } while (puVar125 < end);
            }
            goto LAB_00669687;
          }
          uVar128 = length + 1U >> 1;
          if (length < 0x400) {
            uVar128 = length;
          }
          fetchTransformedBilinearARGB32PM_simple_scale_helper<(TextureBlendType)5>
                    (buffer,buffer + (int)uVar128,&(data->field_23).texture,(int *)&local_3c,
                     (int *)&local_40,uVar126,(int)end);
          puVar125 = buffer + (int)uVar128;
          if (uVar128 == length) goto LAB_00669687;
        }
        fetchTransformedBilinearARGB32PM_simple_scale_helper<(TextureBlendType)5>
                  (puVar125,end,&(data->field_23).texture,(int *)&local_3c,(int *)&local_40,uVar126,
                   (int)end);
        goto LAB_00669687;
      }
    }
  }
  if (0 < length) {
    dVar168 = data->m11;
    dVar138 = data->m12;
    dVar135 = data->m13;
    dVar161 = data->m23 * dVar176 + dVar170 * dVar135 + data->m33;
    dVar134 = data->dx + data->m21 * dVar176 + dVar170 * dVar168;
    dVar170 = data->dy + data->m22 * dVar176 + dVar170 * dVar138;
    puVar4 = (data->field_23).texture.imageData;
    lVar129 = (data->field_23).texture.bytesPerLine;
    puVar125 = buffer;
    do {
      dVar176 = (double)(-(ulong)(dVar161 == 0.0) & 0x3ff0000000000000 |
                        ~-(ulong)(dVar161 == 0.0) & (ulong)(1.0 / dVar161));
      dVar153 = dVar176 * dVar134 + -0.5;
      dVar176 = dVar176 * dVar170 + -0.5;
      auVar178._8_8_ = -(ulong)(dVar176 < 0.0);
      auVar178._0_8_ = -(ulong)(dVar153 < 0.0);
      uVar126 = movmskpd((int)uVar132,auVar178);
      iVar123 = (int)dVar153 - (uVar126 & 1);
      iVar121 = (int)dVar176 - (uVar126 >> 1 & 0x7f);
      uVar126 = (data->field_23).texture.width;
      uVar128 = (data->field_23).texture.height;
      iVar118 = iVar123 % (int)uVar126;
      uVar127 = iVar118 >> 0x1f & uVar126;
      uVar119 = uVar127 + iVar118 + 1;
      if (uVar119 == uVar126) {
        uVar119 = 0;
      }
      iVar124 = iVar121 % (int)uVar128;
      iVar123 = (int)((dVar153 - (double)iVar123) * 256.0);
      uVar130 = (uint)((dVar176 - (double)iVar121) * 256.0);
      uVar117 = iVar124 >> 0x1f & uVar128;
      uVar126 = uVar117 + iVar124 + 1;
      if (uVar126 == uVar128) {
        uVar126 = 0;
      }
      lVar120 = (int)(iVar124 + uVar117) * lVar129;
      lVar122 = (int)uVar126 * lVar129;
      lVar131 = (long)(int)(uVar127 + iVar118);
      uVar169 = *(undefined4 *)(puVar4 + (long)(int)uVar119 * 4 + lVar120);
      uVar1 = *(undefined4 *)(puVar4 + lVar131 * 4 + lVar120);
      uVar2 = *(undefined4 *)(puVar4 + (long)(int)uVar119 * 4 + lVar122);
      uVar3 = *(undefined4 *)(puVar4 + lVar131 * 4 + lVar122);
      uVar132 = CONCAT44(uVar169,uVar1);
      bVar152 = (byte)((uint)uVar169 >> 0x18);
      auVar35._8_6_ = 0;
      auVar35._0_8_ = uVar132;
      auVar35[0xe] = bVar152;
      auVar41._8_4_ = 0;
      auVar41._0_8_ = uVar132;
      auVar41[0xc] = (char)((uint)uVar169 >> 0x10);
      auVar41._13_2_ = auVar35._13_2_;
      auVar47._8_4_ = 0;
      auVar47._0_8_ = uVar132;
      auVar47._12_3_ = auVar41._12_3_;
      auVar53._8_2_ = 0;
      auVar53._0_8_ = uVar132;
      auVar53[10] = (char)((uint)uVar169 >> 8);
      auVar53._11_4_ = auVar47._11_4_;
      auVar59._8_2_ = 0;
      auVar59._0_8_ = uVar132;
      auVar59._10_5_ = auVar53._10_5_;
      auVar65[8] = (char)uVar169;
      auVar65._0_8_ = uVar132;
      auVar65._9_6_ = auVar59._9_6_;
      auVar83._7_8_ = 0;
      auVar83._0_7_ = auVar65._8_7_;
      Var76 = CONCAT81(SUB158(auVar83 << 0x40,7),(char)((uint)uVar1 >> 0x18));
      auVar109._9_6_ = 0;
      auVar109._0_9_ = Var76;
      auVar71[4] = (char)((uint)uVar1 >> 0x10);
      auVar71._0_4_ = uVar1;
      auVar71._5_10_ = SUB1510(auVar109 << 0x30,5);
      auVar84._11_4_ = 0;
      auVar84._0_11_ = auVar71._4_11_;
      auVar85._1_12_ = SUB1512(auVar84 << 0x20,3);
      auVar85[0] = (char)((uint)uVar1 >> 8);
      uVar132 = CONCAT44(uVar2,uVar3);
      auVar143 = pshuflw(ZEXT416(0x100 - uVar130),ZEXT416(0x100 - uVar130),0);
      bVar156 = (byte)((uint)uVar2 >> 0x18);
      auVar36._8_6_ = 0;
      auVar36._0_8_ = uVar132;
      auVar36[0xe] = bVar156;
      auVar42._8_4_ = 0;
      auVar42._0_8_ = uVar132;
      auVar42[0xc] = (char)((uint)uVar2 >> 0x10);
      auVar42._13_2_ = auVar36._13_2_;
      auVar48._8_4_ = 0;
      auVar48._0_8_ = uVar132;
      auVar48._12_3_ = auVar42._12_3_;
      auVar54._8_2_ = 0;
      auVar54._0_8_ = uVar132;
      auVar54[10] = (char)((uint)uVar2 >> 8);
      auVar54._11_4_ = auVar48._11_4_;
      auVar60._8_2_ = 0;
      auVar60._0_8_ = uVar132;
      auVar60._10_5_ = auVar54._10_5_;
      auVar66[8] = (char)uVar2;
      auVar66._0_8_ = uVar132;
      auVar66._9_6_ = auVar60._9_6_;
      auVar86._7_8_ = 0;
      auVar86._0_7_ = auVar66._8_7_;
      Var80 = CONCAT81(SUB158(auVar86 << 0x40,7),(char)((uint)uVar3 >> 0x18));
      auVar110._9_6_ = 0;
      auVar110._0_9_ = Var80;
      auVar72[4] = (char)((uint)uVar3 >> 0x10);
      auVar72._0_4_ = uVar3;
      auVar72._5_10_ = SUB1510(auVar110 << 0x30,5);
      auVar87._11_4_ = 0;
      auVar87._0_11_ = auVar72._4_11_;
      auVar88._1_12_ = SUB1512(auVar87 << 0x20,3);
      auVar88[0] = (char)((uint)uVar3 >> 8);
      auVar158 = pshuflw(ZEXT416(uVar130),ZEXT416(uVar130),0);
      sVar133 = auVar143._0_2_;
      sVar136 = auVar143._2_2_;
      sVar157 = auVar158._0_2_;
      sVar160 = auVar158._2_2_;
      uVar169 = CONCAT22(sVar160 * auVar88._0_2_ + sVar136 * auVar85._0_2_,
                         sVar157 * (ushort)(byte)uVar3 + sVar133 * (ushort)(byte)uVar1);
      auVar182._0_8_ =
           CONCAT26(sVar160 * (short)Var80 + sVar136 * (short)Var76,
                    CONCAT24(sVar157 * auVar72._4_2_ + sVar133 * auVar71._4_2_,uVar169));
      auVar182._8_2_ = sVar157 * auVar66._8_2_ + sVar133 * auVar65._8_2_;
      auVar182._10_2_ = sVar160 * auVar54._10_2_ + sVar136 * auVar53._10_2_;
      auVar183._12_2_ = sVar157 * auVar42._12_2_ + sVar133 * auVar41._12_2_;
      auVar183._0_12_ = auVar182;
      auVar183._14_2_ = sVar160 * (ushort)bVar156 + sVar136 * (ushort)bVar152;
      uVar126 = 0x100 - iVar123;
      uVar132 = (ulong)uVar126;
      auVar177._0_4_ = CONCAT22((short)iVar123,(short)uVar126);
      auVar177._4_4_ = auVar177._0_4_;
      auVar177._8_4_ = auVar177._0_4_;
      auVar177._12_4_ = auVar177._0_4_;
      auVar179._4_4_ = auVar182._8_4_;
      auVar179._0_4_ = uVar169;
      auVar179._8_4_ = (int)((ulong)auVar182._0_8_ >> 0x20);
      auVar179._12_4_ = auVar183._12_4_;
      auVar143 = pshuflw(auVar179,auVar179,0xd8);
      auVar143 = pshufhw(auVar143,auVar143,0xd8);
      auVar180._0_2_ = auVar143._0_2_ >> 8;
      auVar180._2_2_ = auVar143._2_2_ >> 8;
      auVar180._4_2_ = auVar143._4_2_ >> 8;
      auVar180._6_2_ = auVar143._6_2_ >> 8;
      auVar180._8_2_ = auVar143._8_2_ >> 8;
      auVar180._10_2_ = auVar143._10_2_ >> 8;
      auVar180._12_2_ = auVar143._12_2_ >> 8;
      auVar180._14_2_ = auVar143._14_2_ >> 8;
      auVar143 = pmaddwd(auVar180,auVar177);
      auVar181._0_4_ = auVar143._0_4_ >> 8;
      auVar181._4_4_ = auVar143._4_4_ >> 8;
      auVar181._8_4_ = auVar143._8_4_ >> 8;
      auVar181._12_4_ = auVar143._12_4_ >> 8;
      dVar134 = dVar134 + dVar168;
      dVar170 = dVar170 + dVar138;
      auVar143 = packssdw(auVar181,auVar181);
      dVar161 = dVar161 + dVar135;
      sVar133 = auVar143._0_2_;
      sVar136 = auVar143._2_2_;
      sVar157 = auVar143._4_2_;
      sVar160 = auVar143._6_2_;
      *puVar125 = CONCAT13((0 < sVar160) * (sVar160 < 0x100) * auVar143[6] - (0xff < sVar160),
                           CONCAT12((0 < sVar157) * (sVar157 < 0x100) * auVar143[4] -
                                    (0xff < sVar157),
                                    CONCAT11((0 < sVar136) * (sVar136 < 0x100) * auVar143[2] -
                                             (0xff < sVar136),
                                             (0 < sVar133) * (sVar133 < 0x100) * auVar143[0] -
                                             (0xff < sVar133))));
      dVar161 = (double)((ulong)dVar161 & -(ulong)(dVar161 != 0.0) |
                        ~-(ulong)(dVar161 != 0.0) & (ulong)(dVar135 + dVar161));
      puVar125 = puVar125 + 1;
    } while (puVar125 < end);
  }
LAB_00669687:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return buffer;
}

Assistant:

static const uint * QT_FASTCALL fetchTransformedBilinearARGB32PM(uint *buffer, const Operator *,
                                                                 const QSpanData *data, int y, int x,
                                                                 int length)
{
    const qreal cx = x + qreal(0.5);
    const qreal cy = y + qreal(0.5);
    constexpr int tiled = (blendType == BlendTransformedBilinearTiled) ? 1 : 0;

    uint *end = buffer + length;
    uint *b = buffer;
    if (canUseFastMatrixPath(cx, cy, length, data)) {
        // The increment pr x in the scanline
        int fdx = (int)(data->m11 * fixed_scale);
        int fdy = (int)(data->m12 * fixed_scale);

        int fx = int((data->m21 * cy
                      + data->m11 * cx + data->dx) * fixed_scale);
        int fy = int((data->m22 * cy
                      + data->m12 * cx + data->dy) * fixed_scale);

        fx -= half_point;
        fy -= half_point;

        if (fdy == 0) { // simple scale, no rotation or shear
            if (qAbs(fdx) <= fixed_scale) {
                // simple scale up on X
                bilinearFastTransformHelperARGB32PM[tiled][SimpleScaleTransform](b, end, data->texture, fx, fy, fdx, fdy);
            } else if (qAbs(fdx) <= 2 * fixed_scale) {
                // simple scale down on X, less than 2x
                const int mid = (length * 2 < BufferSize) ? length : ((length + 1) / 2);
                bilinearFastTransformHelperARGB32PM[tiled][SimpleScaleTransform](buffer, buffer + mid, data->texture, fx, fy, fdx, fdy);
                if (mid != length)
                    bilinearFastTransformHelperARGB32PM[tiled][SimpleScaleTransform](buffer + mid, buffer + length, data->texture, fx, fy, fdx, fdy);
            } else if (qAbs(data->m22) < qreal(1./8.)) {
                // scale up more than 8x (on Y)
                bilinearFastTransformHelperARGB32PM[tiled][UpscaleTransform](b, end, data->texture, fx, fy, fdx, fdy);
            } else {
                // scale down on X
                bilinearFastTransformHelperARGB32PM[tiled][DownscaleTransform](b, end, data->texture, fx, fy, fdx, fdy);
            }
        } else { // rotation or shear
            if (qAbs(data->m11) < qreal(1./8.) || qAbs(data->m22) < qreal(1./8.) ) {
                // if we are zooming more than 8 times, we use 8bit precision for the position.
                bilinearFastTransformHelperARGB32PM[tiled][RotateTransform](b, end, data->texture, fx, fy, fdx, fdy);
            } else {
                // we are zooming less than 8x, use 4bit precision
                bilinearFastTransformHelperARGB32PM[tiled][FastRotateTransform](b, end, data->texture, fx, fy, fdx, fdy);
            }
        }
    } else {
        const QTextureData &image = data->texture;

        const qreal fdx = data->m11;
        const qreal fdy = data->m12;
        const qreal fdw = data->m13;

        qreal fx = data->m21 * cy + data->m11 * cx + data->dx;
        qreal fy = data->m22 * cy + data->m12 * cx + data->dy;
        qreal fw = data->m23 * cy + data->m13 * cx + data->m33;

        while (b < end) {
            const qreal iw = fw == 0 ? 1 : 1 / fw;
            const qreal px = fx * iw - qreal(0.5);
            const qreal py = fy * iw - qreal(0.5);

            int x1 = int(px) - (px < 0);
            int x2;
            int y1 = int(py) - (py < 0);
            int y2;

            int distx = int((px - x1) * 256);
            int disty = int((py - y1) * 256);

            fetchTransformedBilinear_pixelBounds<blendType>(image.width, image.x1, image.x2 - 1, x1, x2);
            fetchTransformedBilinear_pixelBounds<blendType>(image.height, image.y1, image.y2 - 1, y1, y2);

            const uint *s1 = (const uint *)data->texture.scanLine(y1);
            const uint *s2 = (const uint *)data->texture.scanLine(y2);

            uint tl = s1[x1];
            uint tr = s1[x2];
            uint bl = s2[x1];
            uint br = s2[x2];

            *b = interpolate_4_pixels(tl, tr, bl, br, distx, disty);

            fx += fdx;
            fy += fdy;
            fw += fdw;
            //force increment to avoid /0
            if (!fw) {
                fw += fdw;
            }
            ++b;
        }
    }

    return buffer;
}